

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O1

void __thiscall wasm::BinaryInstWriter::visitAtomicRMW(BinaryInstWriter *this,AtomicRMW *curr)

{
  uint8_t uVar1;
  ulong uVar2;
  int iVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  char *pcVar4;
  uchar local_19;
  
  local_19 = 0xfe;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_19);
  switch(curr->op) {
  case RMWAdd:
    break;
  case RMWSub:
    uVar2 = (curr->super_SpecificExpression<(wasm::Expression::Id)24>).super_Expression.type.id;
    if (6 < uVar2) goto LAB_00cab051;
    iVar3 = (int)uVar2;
    if (iVar3 != 3) {
      if (iVar3 != 2) {
        pcVar4 = "unexpected type";
        goto LAB_00cab125;
      }
      uVar1 = curr->bytes;
      if (uVar1 == '\x04') {
        this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        local_19 = '%';
        goto LAB_00cab027;
      }
      if (uVar1 == '\x02') {
        this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        local_19 = '(';
        goto LAB_00cab027;
      }
      if (uVar1 == '\x01') {
        this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        local_19 = '\'';
        goto LAB_00cab027;
      }
switchD_00caae25_caseD_3:
      pcVar4 = "invalid rmw size";
LAB_00cab125:
      handle_unreachable(pcVar4,
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                         ,0x1e9);
    }
    switch(curr->bytes) {
    case '\x01':
      this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
      local_19 = ')';
      break;
    case '\x02':
      this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
      local_19 = '*';
      break;
    default:
      goto switchD_00caae25_caseD_3;
    case '\x04':
      this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
      local_19 = '+';
      break;
    case '\b':
      this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
      local_19 = '&';
    }
    goto LAB_00cab027;
  case RMWAnd:
    uVar2 = (curr->super_SpecificExpression<(wasm::Expression::Id)24>).super_Expression.type.id;
    if (6 < uVar2) goto LAB_00cab051;
    iVar3 = (int)uVar2;
    if (iVar3 != 3) {
      if (iVar3 != 2) {
        pcVar4 = "unexpected type";
        goto LAB_00cab0dd;
      }
      uVar1 = curr->bytes;
      if (uVar1 == '\x04') {
        this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        local_19 = ',';
        goto LAB_00cab027;
      }
      if (uVar1 == '\x02') {
        this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        local_19 = '/';
        goto LAB_00cab027;
      }
      if (uVar1 == '\x01') {
        this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        local_19 = '.';
        goto LAB_00cab027;
      }
switchD_00caad95_caseD_3:
      pcVar4 = "invalid rmw size";
LAB_00cab0dd:
      handle_unreachable(pcVar4,
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                         ,0x1ea);
    }
    switch(curr->bytes) {
    case '\x01':
      this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
      local_19 = '0';
      break;
    case '\x02':
      this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
      local_19 = '1';
      break;
    default:
      goto switchD_00caad95_caseD_3;
    case '\x04':
      this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
      local_19 = '2';
      break;
    case '\b':
      this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
      local_19 = '-';
    }
    goto LAB_00cab027;
  case RMWOr:
    uVar2 = (curr->super_SpecificExpression<(wasm::Expression::Id)24>).super_Expression.type.id;
    if (6 < uVar2) goto LAB_00cab051;
    iVar3 = (int)uVar2;
    if (iVar3 != 3) {
      if (iVar3 != 2) {
        pcVar4 = "unexpected type";
        goto LAB_00cab0f5;
      }
      uVar1 = curr->bytes;
      if (uVar1 == '\x04') {
        this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        local_19 = '3';
        goto LAB_00cab027;
      }
      if (uVar1 == '\x02') {
        this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        local_19 = '6';
        goto LAB_00cab027;
      }
      if (uVar1 == '\x01') {
        this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        local_19 = '5';
        goto LAB_00cab027;
      }
switchD_00caadc5_caseD_3:
      pcVar4 = "invalid rmw size";
LAB_00cab0f5:
      handle_unreachable(pcVar4,
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                         ,0x1eb);
    }
    switch(curr->bytes) {
    case '\x01':
      this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
      local_19 = '7';
      break;
    case '\x02':
      this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
      local_19 = '8';
      break;
    default:
      goto switchD_00caadc5_caseD_3;
    case '\x04':
      this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
      local_19 = '9';
      break;
    case '\b':
      this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
      local_19 = '4';
    }
    goto LAB_00cab027;
  case RMWXor:
    uVar2 = (curr->super_SpecificExpression<(wasm::Expression::Id)24>).super_Expression.type.id;
    if (6 < uVar2) goto LAB_00cab051;
    iVar3 = (int)uVar2;
    if (iVar3 != 3) {
      if (iVar3 != 2) {
        pcVar4 = "unexpected type";
        goto LAB_00cab0c5;
      }
      uVar1 = curr->bytes;
      if (uVar1 == '\x04') {
        this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        local_19 = ':';
        goto LAB_00cab027;
      }
      if (uVar1 == '\x02') {
        this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        local_19 = '=';
        goto LAB_00cab027;
      }
      if (uVar1 == '\x01') {
        this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        local_19 = '<';
        goto LAB_00cab027;
      }
switchD_00caad65_caseD_3:
      pcVar4 = "invalid rmw size";
LAB_00cab0c5:
      handle_unreachable(pcVar4,
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                         ,0x1ec);
    }
    switch(curr->bytes) {
    case '\x01':
      this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
      local_19 = '>';
      break;
    case '\x02':
      this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
      local_19 = '?';
      break;
    default:
      goto switchD_00caad65_caseD_3;
    case '\x04':
      this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
      local_19 = '@';
      break;
    case '\b':
      this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
      local_19 = ';';
    }
    goto LAB_00cab027;
  case RMWXchg:
    uVar2 = (curr->super_SpecificExpression<(wasm::Expression::Id)24>).super_Expression.type.id;
    if (6 < uVar2) goto LAB_00cab051;
    iVar3 = (int)uVar2;
    if (iVar3 != 3) {
      if (iVar3 != 2) {
        pcVar4 = "unexpected type";
        goto LAB_00cab13d;
      }
      uVar1 = curr->bytes;
      if (uVar1 == '\x04') {
        this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        local_19 = 'A';
        goto LAB_00cab027;
      }
      if (uVar1 == '\x02') {
        this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        local_19 = 'D';
        goto LAB_00cab027;
      }
      if (uVar1 == '\x01') {
        this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
        local_19 = 'C';
        goto LAB_00cab027;
      }
switchD_00caae55_caseD_3:
      pcVar4 = "invalid rmw size";
LAB_00cab13d:
      handle_unreachable(pcVar4,
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                         ,0x1ed);
    }
    switch(curr->bytes) {
    case '\x01':
      this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
      local_19 = 'E';
      break;
    case '\x02':
      this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
      local_19 = 'F';
      break;
    default:
      goto switchD_00caae55_caseD_3;
    case '\x04':
      this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
      local_19 = 'G';
      break;
    case '\b':
      this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
      local_19 = 'B';
    }
    goto LAB_00cab027;
  default:
    handle_unreachable("unexpected op",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                       ,0x1ef);
  }
  uVar2 = (curr->super_SpecificExpression<(wasm::Expression::Id)24>).super_Expression.type.id;
  if (6 < uVar2) {
LAB_00cab051:
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x1c4,"BasicType wasm::Type::getBasic() const");
  }
  iVar3 = (int)uVar2;
  if (iVar3 != 3) {
    if (iVar3 != 2) {
      pcVar4 = "unexpected type";
      goto LAB_00cab10d;
    }
    uVar1 = curr->bytes;
    if (uVar1 == '\x04') {
      this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
      local_19 = '\x1e';
      goto LAB_00cab027;
    }
    if (uVar1 == '\x02') {
      this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
      local_19 = '!';
      goto LAB_00cab027;
    }
    if (uVar1 == '\x01') {
      this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
      local_19 = ' ';
      goto LAB_00cab027;
    }
switchD_00caadf5_caseD_3:
    pcVar4 = "invalid rmw size";
LAB_00cab10d:
    handle_unreachable(pcVar4,
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                       ,0x1e8);
  }
  switch(curr->bytes) {
  case '\x01':
    this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
    local_19 = '\"';
    break;
  case '\x02':
    this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
    local_19 = '#';
    break;
  default:
    goto switchD_00caadf5_caseD_3;
  case '\x04':
    this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
    local_19 = '$';
    break;
  case '\b':
    this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
    local_19 = '\x1f';
  }
LAB_00cab027:
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (this_00,&local_19);
  emitMemoryAccess(this,(ulong)curr->bytes,(ulong)curr->bytes,(curr->offset).addr,
                   (Name)(curr->memory).super_IString.str);
  return;
}

Assistant:

void BinaryInstWriter::visitAtomicRMW(AtomicRMW* curr) {
  o << int8_t(BinaryConsts::AtomicPrefix);

#define CASE_FOR_OP(Op)                                                        \
  case RMW##Op:                                                                \
    switch (curr->type.getBasic()) {                                           \
      case Type::i32:                                                          \
        switch (curr->bytes) {                                                 \
          case 1:                                                              \
            o << int8_t(BinaryConsts::I32AtomicRMW##Op##8U);                   \
            break;                                                             \
          case 2:                                                              \
            o << int8_t(BinaryConsts::I32AtomicRMW##Op##16U);                  \
            break;                                                             \
          case 4:                                                              \
            o << int8_t(BinaryConsts::I32AtomicRMW##Op);                       \
            break;                                                             \
          default:                                                             \
            WASM_UNREACHABLE("invalid rmw size");                              \
        }                                                                      \
        break;                                                                 \
      case Type::i64:                                                          \
        switch (curr->bytes) {                                                 \
          case 1:                                                              \
            o << int8_t(BinaryConsts::I64AtomicRMW##Op##8U);                   \
            break;                                                             \
          case 2:                                                              \
            o << int8_t(BinaryConsts::I64AtomicRMW##Op##16U);                  \
            break;                                                             \
          case 4:                                                              \
            o << int8_t(BinaryConsts::I64AtomicRMW##Op##32U);                  \
            break;                                                             \
          case 8:                                                              \
            o << int8_t(BinaryConsts::I64AtomicRMW##Op);                       \
            break;                                                             \
          default:                                                             \
            WASM_UNREACHABLE("invalid rmw size");                              \
        }                                                                      \
        break;                                                                 \
      default:                                                                 \
        WASM_UNREACHABLE("unexpected type");                                   \
    }                                                                          \
    break

  switch (curr->op) {
    CASE_FOR_OP(Add);
    CASE_FOR_OP(Sub);
    CASE_FOR_OP(And);
    CASE_FOR_OP(Or);
    CASE_FOR_OP(Xor);
    CASE_FOR_OP(Xchg);
    default:
      WASM_UNREACHABLE("unexpected op");
  }
#undef CASE_FOR_OP

  emitMemoryAccess(curr->bytes, curr->bytes, curr->offset, curr->memory);
}